

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_cparse.c
# Opt level: O0

CTypeID cp_decl_intern(CPState *cp,CPDecl *decl)

{
  CTypeID CVar1;
  uint uVar2;
  uint *puVar3;
  uint *puVar4;
  long in_RSI;
  long in_RDI;
  uint64_t xsz;
  CType *ctn_1;
  CTSize esize;
  CTSize malign;
  CTSize vsize;
  CTSize msize;
  CType *ctn;
  CType *refct;
  CTypeID sib;
  CTypeID fid;
  CType *fct;
  CTInfo size;
  CTInfo info;
  CType *ct;
  CTSize cinfo;
  CTSize csize;
  CPDeclIdx idx;
  CTypeID id;
  CType *ct_2;
  CType *ct_1;
  ErrMsg in_stack_fffffffffffffe7c;
  CPState *in_stack_fffffffffffffe80;
  CTInfo info_00;
  CTState *in_stack_fffffffffffffe88;
  uint in_stack_fffffffffffffe90;
  uint in_stack_fffffffffffffe94;
  uint local_168;
  uint *local_148;
  uint local_140;
  uint local_13c;
  uint local_130;
  uint local_12c;
  uint local_128;
  uint local_124;
  uint *local_110;
  uint *local_f8;
  
  local_124 = 0;
  local_128 = 0;
  local_12c = 0xffffffff;
  local_130 = 0;
  do {
    puVar3 = (uint *)(in_RSI + 0x40 + (ulong)local_128 * 0x10);
    local_13c = *puVar3;
    local_140 = puVar3[1];
    local_128 = (uint)*(ushort *)((long)puVar3 + 10);
    if (local_13c >> 0x1c == 7) {
      local_124 = local_13c & 0xffff;
      local_130 = *(uint *)(**(long **)(in_RDI + 0x40) + (ulong)local_124 * 0x10);
      local_12c = *(uint *)(**(long **)(in_RDI + 0x40) + (ulong)local_124 * 0x10 + 4);
    }
    else if (local_13c >> 0x1c == 6) {
      if (local_124 != 0) {
        for (local_f8 = (uint *)(**(long **)(in_RDI + 0x40) + (ulong)local_124 * 0x10);
            *local_f8 >> 0x1c == 8;
            local_f8 = (uint *)(**(long **)(in_RDI + 0x40) + (ulong)(*local_f8 & 0xffff) * 0x10)) {
        }
        if ((*local_f8 >> 0x1c == 6) || ((*local_f8 & 0xfc000000) == 0x30000000)) {
          cp_err(in_stack_fffffffffffffe80,in_stack_fffffffffffffe7c);
        }
      }
      while ((local_128 != 0 &&
             (puVar4 = (uint *)(in_RSI + 0x40 + (ulong)local_128 * 0x10), *puVar4 >> 0x1c == 8))) {
        local_128 = (uint)*(ushort *)((long)puVar4 + 10);
      }
      uVar2 = puVar3[2];
      CVar1 = lj_ctype_new((CTState *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                           &in_stack_fffffffffffffe88->tab);
      local_12c = 0xffffffff;
      local_130 = local_13c + local_124;
      *local_148 = local_130;
      local_148[1] = local_140;
      *(short *)(local_148 + 2) = (short)uVar2;
      local_124 = CVar1;
    }
    else {
      info_00 = (CTInfo)((ulong)in_stack_fffffffffffffe80 >> 0x20);
      if (local_13c >> 0x1c == 8) {
        if ((local_13c & 0xf0ff0000) == 0x80010000) {
          local_130 = local_140 | local_130;
        }
        else if ((local_13c & 0xf0ff0000) == 0x80020000) {
          local_130 = local_130 & 0xfff0ffff | (local_140 & 0xf) << 0x10;
        }
        local_124 = lj_ctype_intern(in_stack_fffffffffffffe88,info_00,
                                    (CTSize)in_stack_fffffffffffffe80);
      }
      else {
        if (local_13c >> 0x1c == 0) {
          if ((local_13c & 0x8000000) == 0) {
            uVar2 = *(uint *)(in_RSI + 0x2c) >> 8 & 0xff;
            local_168 = *(uint *)(in_RSI + 0x2c) >> 4 & 0xf;
            if ((uVar2 != 0) && ((((local_13c & 0x4000000) == 0 || (uVar2 == 4)) || (uVar2 == 8))))
            {
              in_stack_fffffffffffffe94 = 0x1f;
              if (uVar2 != 0) {
                for (; uVar2 >> in_stack_fffffffffffffe94 == 0;
                    in_stack_fffffffffffffe94 = in_stack_fffffffffffffe94 - 1) {
                }
              }
              if (4 < in_stack_fffffffffffffe94) {
                in_stack_fffffffffffffe94 = 4;
              }
              local_13c = local_13c & 0xfff0ffff | (in_stack_fffffffffffffe94 & 0xf) << 0x10;
              local_140 = uVar2;
            }
            if (local_168 != 0) {
              in_stack_fffffffffffffe90 = 0x1f;
              if (local_140 != 0) {
                for (; local_140 >> in_stack_fffffffffffffe90 == 0;
                    in_stack_fffffffffffffe90 = in_stack_fffffffffffffe90 - 1) {
                }
              }
              if (in_stack_fffffffffffffe90 <= local_168) {
                local_124 = lj_ctype_intern(in_stack_fffffffffffffe88,info_00,
                                            (CTSize)in_stack_fffffffffffffe80);
                local_140 = 1 << (sbyte)local_168;
                if (4 < local_168) {
                  local_168 = 4;
                }
                if (local_168 < (local_13c >> 0x10 & 0xf)) {
                  local_168 = local_13c >> 0x10 & 0xf;
                }
                local_13c = (local_13c & 0x3000000) + local_168 * 0x10000 + 0x38000000;
              }
            }
          }
        }
        else if (local_13c >> 0x1c == 2) {
          if (local_124 != 0) {
            for (local_110 = (uint *)(**(long **)(in_RDI + 0x40) + (ulong)local_124 * 0x10);
                *local_110 >> 0x1c == 8;
                local_110 = (uint *)(**(long **)(in_RDI + 0x40) +
                                    (ulong)(*local_110 & 0xffff) * 0x10)) {
            }
            if ((*local_110 & 0xf0800000) == 0x20800000) {
              cp_err(in_stack_fffffffffffffe80,in_stack_fffffffffffffe7c);
            }
          }
          if ((local_13c & 0xf0800000) == 0x20800000) {
            local_13c = local_13c & 0xfeffffff;
            while ((local_128 != 0 &&
                   (in_stack_fffffffffffffe88 = (CTState *)(in_RSI + 0x40 + (ulong)local_128 * 0x10)
                   , *(uint *)&in_stack_fffffffffffffe88->tab >> 0x1c == 8))) {
              local_128 = (uint)*(ushort *)((long)&in_stack_fffffffffffffe88->top + 2);
            }
          }
        }
        else if (local_13c >> 0x1c == 3) {
          if ((short)puVar3[2] == 0) {
            if ((local_130 & 0xf0800000) == 0x20800000) {
              cp_err(in_stack_fffffffffffffe80,in_stack_fffffffffffffe7c);
            }
            if (((local_130 & 0xd0100000) == 0x10100000) || (local_12c == 0xffffffff)) {
              cp_err(in_stack_fffffffffffffe80,in_stack_fffffffffffffe7c);
            }
            if (local_140 != 0xffffffff) {
              in_stack_fffffffffffffe80 = (CPState *)((ulong)local_140 * (ulong)local_12c);
              if ((CPState *)0x7fffffff < in_stack_fffffffffffffe80) {
                cp_err(in_stack_fffffffffffffe80,in_stack_fffffffffffffe7c);
              }
              local_140 = (uint)in_stack_fffffffffffffe80;
            }
          }
          if ((local_13c & 0xf0000) < (local_130 & 0xf0000)) {
            local_13c = local_13c & 0xfff0ffff | local_130 & 0xf0000;
          }
          local_13c = local_130 & 0x3000000 | local_13c;
        }
        local_12c = local_140;
        local_130 = local_13c + local_124;
        local_124 = lj_ctype_intern(in_stack_fffffffffffffe88,
                                    (CTInfo)((ulong)in_stack_fffffffffffffe80 >> 0x20),
                                    (CTSize)in_stack_fffffffffffffe80);
      }
    }
    if (local_128 == 0) {
      return local_124;
    }
  } while( true );
}

Assistant:

static CTypeID cp_decl_intern(CPState *cp, CPDecl *decl)
{
  CTypeID id = 0;
  CPDeclIdx idx = 0;
  CTSize csize = CTSIZE_INVALID;
  CTSize cinfo = 0;
  do {
    CType *ct = &decl->stack[idx];
    CTInfo info = ct->info;
    CTInfo size = ct->size;
    /* The cid is already part of info for copies of pointers/functions. */
    idx = ct->next;
    if (ctype_istypedef(info)) {
      lua_assert(id == 0);
      id = ctype_cid(info);
      /* Always refetch info/size, since struct/enum may have been completed. */
      cinfo = ctype_get(cp->cts, id)->info;
      csize = ctype_get(cp->cts, id)->size;
      lua_assert(ctype_isstruct(cinfo) || ctype_isenum(cinfo));
    } else if (ctype_isfunc(info)) {  /* Intern function. */
      CType *fct;
      CTypeID fid;
      CTypeID sib;
      if (id) {
	CType *refct = ctype_raw(cp->cts, id);
	/* Reject function or refarray return types. */
	if (ctype_isfunc(refct->info) || ctype_isrefarray(refct->info))
	  cp_err(cp, LJ_ERR_FFI_INVTYPE);
      }
      /* No intervening attributes allowed, skip forward. */
      while (idx) {
	CType *ctn = &decl->stack[idx];
	if (!ctype_isattrib(ctn->info)) break;
	idx = ctn->next;  /* Skip attribute. */
      }
      sib = ct->sib;  /* Next line may reallocate the C type table. */
      fid = lj_ctype_new(cp->cts, &fct);
      csize = CTSIZE_INVALID;
      fct->info = cinfo = info + id;
      fct->size = size;
      fct->sib = sib;
      id = fid;
    } else if (ctype_isattrib(info)) {
      if (ctype_isxattrib(info, CTA_QUAL))
	cinfo |= size;
      else if (ctype_isxattrib(info, CTA_ALIGN))
	CTF_INSERT(cinfo, ALIGN, size);
      id = lj_ctype_intern(cp->cts, info+id, size);
      /* Inherit csize/cinfo from original type. */
    } else {
      if (ctype_isnum(info)) {  /* Handle mode/vector-size attributes. */
	lua_assert(id == 0);
	if (!(info & CTF_BOOL)) {
	  CTSize msize = ctype_msizeP(decl->attr);
	  CTSize vsize = ctype_vsizeP(decl->attr);
	  if (msize && (!(info & CTF_FP) || (msize == 4 || msize == 8))) {
	    CTSize malign = lj_fls(msize);
	    if (malign > 4) malign = 4;  /* Limit alignment. */
	    CTF_INSERT(info, ALIGN, malign);
	    size = msize;  /* Override size via mode. */
	  }
	  if (vsize) {  /* Vector size set? */
	    CTSize esize = lj_fls(size);
	    if (vsize >= esize) {
	      /* Intern the element type first. */
	      id = lj_ctype_intern(cp->cts, info, size);
	      /* Then create a vector (array) with vsize alignment. */
	      size = (1u << vsize);
	      if (vsize > 4) vsize = 4;  /* Limit alignment. */
	      if (ctype_align(info) > vsize) vsize = ctype_align(info);
	      info = CTINFO(CT_ARRAY, (info & CTF_QUAL) + CTF_VECTOR +
				      CTALIGN(vsize));
	    }
	  }
	}
      } else if (ctype_isptr(info)) {
	/* Reject pointer/ref to ref. */
	if (id && ctype_isref(ctype_raw(cp->cts, id)->info))
	  cp_err(cp, LJ_ERR_FFI_INVTYPE);
	if (ctype_isref(info)) {
	  info &= ~CTF_VOLATILE;  /* Refs are always const, never volatile. */
	  /* No intervening attributes allowed, skip forward. */
	  while (idx) {
	    CType *ctn = &decl->stack[idx];
	    if (!ctype_isattrib(ctn->info)) break;
	    idx = ctn->next;  /* Skip attribute. */
	  }
	}
      } else if (ctype_isarray(info)) {  /* Check for valid array size etc. */
	if (ct->sib == 0) {  /* Only check/size arrays not copied by unroll. */
	  if (ctype_isref(cinfo))  /* Reject arrays of refs. */
	    cp_err(cp, LJ_ERR_FFI_INVTYPE);
	  /* Reject VLS or unknown-sized types. */
	  if (ctype_isvltype(cinfo) || csize == CTSIZE_INVALID)
	    cp_err(cp, LJ_ERR_FFI_INVSIZE);
	  /* a[] and a[?] keep their invalid size. */
	  if (size != CTSIZE_INVALID) {
	    uint64_t xsz = (uint64_t)size * csize;
	    if (xsz >= 0x80000000u) cp_err(cp, LJ_ERR_FFI_INVSIZE);
	    size = (CTSize)xsz;
	  }
	}
	if ((cinfo & CTF_ALIGN) > (info & CTF_ALIGN))  /* Find max. align. */
	  info = (info & ~CTF_ALIGN) | (cinfo & CTF_ALIGN);
	info |= (cinfo & CTF_QUAL);  /* Inherit qual. */
      } else {
	lua_assert(ctype_isvoid(info));
      }
      csize = size;
      cinfo = info+id;
      id = lj_ctype_intern(cp->cts, info+id, size);
    }
  } while (idx);
  return id;
}